

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O2

void __thiscall
ON_ArchivableDictionaryPrivate::ON_ArchivableDictionaryPrivate
          (ON_ArchivableDictionaryPrivate *this,ON_ArchivableDictionaryPrivate *other)

{
  _Rb_tree_header *p_Var1;
  DictionaryEntry *pDVar2;
  mapped_type *pmVar3;
  DictionaryEntry *pDVar4;
  _Base_ptr p_Var5;
  
  this->m_version = other->m_version;
  ON_wString::ON_wString(&this->m_name,&other->m_name);
  p_Var1 = &(this->m_map)._M_t._M_impl.super__Rb_tree_header;
  (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var5 = (other->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(other->m_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    pmVar3 = std::
             map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
             ::operator[](&this->m_map,(key_type *)(p_Var5 + 1));
    pDVar4 = (DictionaryEntry *)(**(code **)(*(long *)p_Var5[1]._M_parent + 0x18))();
    pDVar2 = (pmVar3->_M_t).
             super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>._M_t.
             super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
             super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl;
    (pmVar3->_M_t).super___uniq_ptr_impl<DictionaryEntry,_std::default_delete<DictionaryEntry>_>.
    _M_t.super__Tuple_impl<0UL,_DictionaryEntry_*,_std::default_delete<DictionaryEntry>_>.
    super__Head_base<0UL,_DictionaryEntry_*,_false>._M_head_impl = pDVar4;
    if (pDVar2 != (DictionaryEntry *)0x0) {
      (*pDVar2->_vptr_DictionaryEntry[1])();
    }
  }
  return;
}

Assistant:

ON_ArchivableDictionaryPrivate(const ON_ArchivableDictionaryPrivate& other) :
    m_version(other.m_version),
    m_name(other.m_name)
  {
    for (const auto & item : other.m_map)
    {
      const auto& key = item.first;
      const auto& value = item.second;
      m_map[key].reset(value->Duplicate());
    }
  }